

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  unsigned_short uVar3;
  int iVar4;
  StructDataBitCount SVar5;
  word *pwVar6;
  CapTableReader *pCVar7;
  int iVar8;
  undefined4 extraout_var;
  SegmentReader *pSVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  uint uVar13;
  ElementSize EVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  WirePointer *pWVar18;
  WirePointer *pWVar19;
  ulong uVar20;
  bool bVar21;
  SegmentReader *pSVar9;
  undefined4 extraout_var_00;
  
  pWVar18 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar18 = this->pointer;
  }
  pSVar9 = this->segment;
  pWVar19 = pWVar18 + 1;
  lVar15 = (long)((int)*(uint64_t *)&(pWVar18->offsetAndKind).value >> 2);
  if (pSVar9 == (SegmentReader *)0x0) {
    pWVar12 = pWVar19 + lVar15;
  }
  else {
    pwVar6 = (pSVar9->ptr).ptr;
    pWVar12 = (WirePointer *)(pwVar6 + (pSVar9->ptr).size_);
    if (((long)pwVar6 - (long)pWVar19 >> 3 <= lVar15) &&
       (lVar15 <= (long)pWVar12 - (long)pWVar19 >> 3)) {
      pWVar12 = pWVar19 + lVar15;
    }
  }
  pCVar7 = this->capTable;
  iVar4 = this->nestingLimit;
  pWVar19 = (WirePointer *)defaultValue;
  if ((pWVar18->field_1).upper32Bits != 0 || (int)*(uint64_t *)&(pWVar18->offsetAndKind).value != 0)
  goto LAB_00201d48;
  do {
    while( true ) {
      if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
         (iVar8 = (int)*(uint64_t *)&(((WirePointer *)defaultValue)->offsetAndKind).value,
         (((WirePointer *)defaultValue)->field_1).upper32Bits == 0 && iVar8 == 0)) {
        __return_storage_ptr__->ptr = (byte *)0x0;
        __return_storage_ptr__->elementCount = 0;
        __return_storage_ptr__->step = 0;
        __return_storage_ptr__->segment = (SegmentReader *)0x0;
        __return_storage_ptr__->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
        __return_storage_ptr__->nestingLimit = 0x7fffffff;
        return __return_storage_ptr__;
      }
      pWVar12 = (WirePointer *)defaultValue + (long)(iVar8 >> 2) + 1;
      pSVar9 = (SegmentReader *)0x0;
      pWVar19 = (WirePointer *)0x0;
      pWVar18 = (WirePointer *)defaultValue;
LAB_00201d48:
      defaultValue = (word *)pWVar19;
      if (0 < iVar4) break;
      getListAnySize();
    }
    pWVar19 = pWVar18;
    if ((pSVar9 != (SegmentReader *)0x0) &&
       ((*(uint64_t *)&(pWVar18->offsetAndKind).value & 3) == 2)) {
      iVar8 = (*pSVar9->arena->_vptr_Arena[2])(pSVar9->arena,(ulong)(pWVar18->field_1).upper32Bits);
      pSVar9 = (SegmentReader *)CONCAT44(extraout_var,iVar8);
      if (pSVar9 == (SegmentReader *)0x0) {
        getListAnySize();
        pWVar12 = (WirePointer *)0x0;
      }
      else {
        uVar13 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
        uVar11 = (ulong)(uVar13 >> 3);
        uVar20 = (pSVar9->ptr).size_;
        if ((long)uVar20 < (long)uVar11) {
          uVar11 = uVar20;
        }
        uVar17 = 2 - (ulong)((uVar13 & 4) == 0);
        if (uVar11 + uVar17 <= uVar20) {
          pWVar19 = (WirePointer *)((pSVar9->ptr).ptr + uVar11);
          uVar20 = pSVar9->readLimiter->limit;
          if (uVar17 <= uVar20) {
            pSVar9->readLimiter->limit = uVar20 - uVar17;
            pWVar1 = pWVar19 + 1;
            if ((*(uint64_t *)&(pWVar18->offsetAndKind).value & 4) == 0) {
              lVar15 = (long)((int)*(uint64_t *)&(pWVar19->offsetAndKind).value >> 2);
              pwVar6 = (pSVar9->ptr).ptr;
              pWVar12 = (WirePointer *)(pwVar6 + (pSVar9->ptr).size_);
              if (((long)pwVar6 - (long)pWVar1 >> 3 <= lVar15) &&
                 (lVar15 <= (long)pWVar12 - (long)pWVar1 >> 3)) {
                pWVar12 = pWVar1 + lVar15;
              }
            }
            else {
              iVar8 = (*pSVar9->arena->_vptr_Arena[2])
                                (pSVar9->arena,(ulong)(pWVar19->field_1).upper32Bits);
              pSVar10 = (SegmentReader *)CONCAT44(extraout_var_00,iVar8);
              if (pSVar10 == (SegmentReader *)0x0) {
                getListAnySize();
              }
              else {
                uVar13 = (uint)*(uint64_t *)&(pWVar19->offsetAndKind).value;
                if ((uVar13 & 3) == 2) {
                  uVar11 = (ulong)(uVar13 >> 3);
                  uVar20 = (pSVar10->ptr).size_;
                  if ((long)uVar20 < (long)uVar11) {
                    uVar11 = uVar20;
                  }
                  pWVar12 = (WirePointer *)((pSVar10->ptr).ptr + uVar11);
                  pWVar19 = pWVar1;
                  pSVar9 = pSVar10;
                  goto LAB_00201e89;
                }
                getListAnySize();
              }
              pWVar12 = (WirePointer *)0x0;
              pWVar19 = pWVar1;
            }
            goto LAB_00201e89;
          }
          (*pSVar9->arena->_vptr_Arena[3])();
        }
        getListAnySize();
        pWVar12 = (WirePointer *)0x0;
        pWVar19 = pWVar18;
      }
    }
LAB_00201e89:
    bVar21 = pWVar12 == (WirePointer *)0x0;
    if (!bVar21) {
      if ((*(uint64_t *)&(pWVar19->offsetAndKind).value & 3) == 1) {
        uVar13 = (pWVar19->field_1).upper32Bits;
        EVar14 = (ElementSize)uVar13 & INLINE_COMPOSITE;
        if (EVar14 == INLINE_COMPOSITE) {
          uVar20 = (ulong)(uVar13 >> 3);
          if (pSVar9 == (SegmentReader *)0x0) {
LAB_00201f0c:
            uVar13 = (uint)*(uint64_t *)&(pWVar12->offsetAndKind).value;
            if ((uVar13 & 3) == 0) {
              uVar13 = uVar13 >> 2 & 0x1fffffff;
              uVar11 = (ulong)uVar13;
              uVar16 = (uint)(pWVar12->field_1).structRef.ptrCount.value +
                       (uint)(pWVar12->field_1).structRef.dataSize.value;
              if (uVar16 * uVar11 < uVar20 || uVar16 * uVar11 - uVar20 == 0) {
                if ((pSVar9 != (SegmentReader *)0x0) && (uVar16 == 0)) {
                  uVar20 = pSVar9->readLimiter->limit;
                  if (uVar20 < uVar11) {
                    (*pSVar9->arena->_vptr_Arena[3])();
                    getListAnySize();
                    bVar21 = true;
                    goto LAB_002020a1;
                  }
                  pSVar9->readLimiter->limit = uVar20 - uVar11;
                }
                uVar2 = (pWVar12->field_1).structRef.dataSize.value;
                uVar3 = (pWVar12->field_1).structRef.ptrCount.value;
                __return_storage_ptr__->segment = pSVar9;
                __return_storage_ptr__->capTable = pCVar7;
                __return_storage_ptr__->ptr = (byte *)(pWVar12 + 1);
                __return_storage_ptr__->elementCount = uVar13;
                __return_storage_ptr__->step = uVar16 * 0x40;
                __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
                __return_storage_ptr__->structPointerCount = uVar3;
                __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
                __return_storage_ptr__->nestingLimit = iVar4 + -1;
                bVar21 = false;
                goto LAB_002020a1;
              }
              getListAnySize();
            }
            else {
              getListAnySize();
            }
            bVar21 = true;
            goto LAB_002020a1;
          }
          if (((long)pWVar12 - (long)(pSVar9->ptr).ptr >> 3) + uVar20 + 1 <= (pSVar9->ptr).size_) {
            uVar11 = pSVar9->readLimiter->limit;
            if (uVar20 + 1 <= uVar11) {
              pSVar9->readLimiter->limit = uVar11 - (uVar20 + 1);
              goto LAB_00201f0c;
            }
            (*pSVar9->arena->_vptr_Arena[3])();
          }
          getListAnySize();
        }
        else {
          SVar5 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar14 * 4);
          uVar20 = (ulong)(uVar13 >> 3);
          uVar16 = (uint)(EVar14 == POINTER) * 0x40 + SVar5;
          if (pSVar9 == (SegmentReader *)0x0) {
LAB_00202039:
            if ((pSVar9 != (SegmentReader *)0x0) && ((uVar13 & 7) == 0)) {
              uVar11 = pSVar9->readLimiter->limit;
              if (uVar11 < uVar20) {
                (*pSVar9->arena->_vptr_Arena[3])();
                getListAnySize();
                goto LAB_00202111;
              }
              pSVar9->readLimiter->limit = uVar11 - uVar20;
            }
            __return_storage_ptr__->segment = pSVar9;
            __return_storage_ptr__->capTable = pCVar7;
            __return_storage_ptr__->ptr = (byte *)pWVar12;
            __return_storage_ptr__->elementCount = uVar13 >> 3;
            __return_storage_ptr__->step = uVar16;
            __return_storage_ptr__->structDataSize = SVar5;
            __return_storage_ptr__->structPointerCount = (ushort)(EVar14 == POINTER);
            __return_storage_ptr__->elementSize = EVar14;
            __return_storage_ptr__->nestingLimit = iVar4 + -1;
            bVar21 = false;
            goto LAB_002020a1;
          }
          uVar11 = uVar16 * uVar20 + 0x3f >> 6 & 0xffffffff;
          if (((long)pWVar12 - (long)(pSVar9->ptr).ptr >> 3) + uVar11 <= (pSVar9->ptr).size_) {
            uVar17 = pSVar9->readLimiter->limit;
            if (uVar11 <= uVar17) {
              pSVar9->readLimiter->limit = uVar17 - uVar11;
              goto LAB_00202039;
            }
            (*pSVar9->arena->_vptr_Arena[3])();
          }
          getListAnySize();
        }
      }
      else {
        getListAnySize();
      }
LAB_00202111:
      bVar21 = true;
    }
LAB_002020a1:
    if (!bVar21) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}